

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O0

const_iterator * __thiscall
Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::cend
          (const_iterator *__return_storage_ptr__,Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *this
          )

{
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *this_local;
  
  end(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

typename Matrix_Sparse_Row<_matrix_type>::const_iterator Matrix_Sparse_Row<_matrix_type>::cend() const {
  return end();
}